

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getTypeDefinition_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this)

{
  int iVar1;
  pointer ptVar2;
  TestError *this_00;
  
  iVar1 = this->m_current_test_case_index;
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(ptVar2[iVar1].m_initializer) {
  case VECTOR:
  case MATRIX:
  case MATRIX_ROWS:
  case ARRAY_SCALAR:
  case ARRAY_VECTOR_CTR:
  case ARRAY_VECTOR_LIST:
  case ARRAY_MATRIX_CTR:
  case ARRAY_MATRIX_LIST:
  case UNSIZED_ARRAY_SCALAR:
  case UNSIZED_ARRAY_VECTOR:
  case UNSIZED_ARRAY_MATRIX:
    goto LAB_00a6d537;
  case STRUCT:
  case ARRAY_STRUCT:
  case UNSIZED_ARRAY_STRUCT:
LAB_00a6d537:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  case NESTED_STRUCT_CTR:
  case NESTED_STRUCT_LIST:
  case NESTED_ARRAY_STRUCT_STRUCT_LIST:
  case NESTED_ARRAY_STRUCT_STRUCT_MIX:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_LIST:
  case NESTED_STURCT_ARRAYS_STRUCT_MIX:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_LIST:
  case NESTED_STRUCT_STRUCT_ARRAY_MIX:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x3838);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getTypeDefinition()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	static const GLchar* basic_struct = "struct BasicStructure {\n"
										"    vec4 member_a;\n"
										"    vec4 member_b;\n"
										"};\n";

	static const GLchar* struct_with_array = "struct StructureWithArray {\n"
											 "    vec4 member_a;\n"
											 "    vec4 member_b[2];\n"
											 "};\n";

	static const GLchar* struct_with_struct = "struct StructureWithStructure {\n"
											  "    BasicStructure member_a;\n"
											  "    vec4           member_b;\n"
											  "};\n";

	static const GLchar* struct_with_struct_array = "struct StructureWithStructArray {\n"
													"    vec4           member_a;\n"
													"    BasicStructure member_b[3];\n"
													"};\n";

	static const GLchar* struct_with_struct_with_array = "struct StructureWithStructureWithArray {\n"
														 "    StructureWithArray member_a;\n"
														 "    vec4               member_b;\n"
														 "};\n";

	std::string type_definition;

	switch (test_case.m_initializer)
	{
	case VECTOR:
	case MATRIX:
	case MATRIX_ROWS:
	case ARRAY_SCALAR:
	case ARRAY_VECTOR_CTR:
	case ARRAY_VECTOR_LIST:
	case ARRAY_MATRIX_CTR:
	case ARRAY_MATRIX_LIST:
	case UNSIZED_ARRAY_SCALAR:
	case UNSIZED_ARRAY_VECTOR:
	case UNSIZED_ARRAY_MATRIX:
		type_definition = "";
		break;
	case STRUCT:
	case ARRAY_STRUCT:
	case UNSIZED_ARRAY_STRUCT:
		type_definition = basic_struct;
		break;
	case NESTED_STRUCT_CTR:
	case NESTED_STRUCT_LIST:
	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		type_definition = basic_struct;
		type_definition.append(struct_with_struct);
		break;
	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		type_definition = basic_struct;
		type_definition.append(struct_with_struct_array);
		break;
	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		type_definition = struct_with_array;
		type_definition.append(struct_with_struct_with_array);
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return type_definition;
}